

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O3

int __thiscall
OB::Parg::parse_args
          (Parg *this,int _argc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *_argv)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  undefined1 uVar3;
  int iVar4;
  long lVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  long *plVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  undefined8 uVar11;
  size_type *psVar12;
  ulong uVar13;
  pointer __rhs;
  undefined8 uVar14;
  int iVar15;
  ulong uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string *local_a8;
  undefined1 local_a0 [8];
  string c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_60;
  undefined1 local_58 [8];
  string a;
  
  if (_argc < 1) {
    iVar15 = 1;
  }
  else {
    local_60 = &this->flags_;
    p_Var1 = &(this->flags_)._M_t._M_impl.super__Rb_tree_header;
    a.field_2._8_8_ = &this->data_;
    local_a8 = (string *)&this->error_;
    uVar16 = 0;
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (c.field_2._M_local_buf + 8);
    iVar15 = 0;
    do {
      __rhs = (_argv->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(_argv->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)__rhs >> 5) <=
          (ulong)(long)iVar15) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00111a0b:
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar16);
LAB_00111a1c:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",__rhs
                  );
LAB_00111a2d:
        uVar11 = std::__throw_out_of_range_fmt
                           ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            ,__rhs);
        if (local_58 != (undefined1  [8])&a._M_string_length) {
          operator_delete((void *)local_58,a._M_string_length + 1);
        }
        if (local_a0 != (undefined1  [8])&c._M_string_length) {
          operator_delete((void *)local_a0,c._M_string_length + 1);
        }
        _Unwind_Resume(uVar11);
      }
      __rhs = __rhs + iVar15;
      if (uVar16 == 0) {
        uVar13 = __rhs->_M_string_length;
        if (uVar13 < 2) {
          if (uVar13 == 0) goto LAB_0011191b;
LAB_001110ac:
          if (this->is_positional_ != true) {
LAB_0011191b:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_58,"no match for \'",__rhs);
            plVar8 = (long *)std::__cxx11::string::append((char *)local_58);
            psVar12 = (size_type *)(plVar8 + 2);
            if ((size_type *)*plVar8 == psVar12) {
              c._M_string_length = *psVar12;
              c.field_2._M_allocated_capacity = plVar8[3];
              local_a0 = (undefined1  [8])&c._M_string_length;
            }
            else {
              c._M_string_length = *psVar12;
              local_a0 = (undefined1  [8])*plVar8;
            }
            c._M_dataplus._M_p = (pointer)plVar8[1];
            *plVar8 = (long)psVar12;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::__cxx11::string::operator=(local_a8,(string *)local_a0);
            if (local_a0 != (undefined1  [8])&c._M_string_length) {
              operator_delete((void *)local_a0,c._M_string_length + 1);
            }
            if (local_58 != (undefined1  [8])&a._M_string_length) {
              operator_delete((void *)local_58,a._M_string_length + 1);
            }
            find_similar(this,__rhs);
            return -1;
          }
          iVar4 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar4 != 0) goto LAB_001110d3;
          uVar16 = 1;
        }
        else {
          pcVar2 = (__rhs->_M_dataplus)._M_p;
          if (*pcVar2 != '-') goto LAB_001110ac;
          if (pcVar2[1] == 0x2d) {
            if ((uVar13 == 2) || (pcVar2[1] != '-')) goto LAB_001110ac;
            std::__cxx11::string::substr((ulong)local_a0,(ulong)__rhs);
            local_58 = (undefined1  [8])&a._M_string_length;
            a._M_dataplus._M_p = (pointer)0x0;
            a._M_string_length = a._M_string_length & 0xffffffffffffff00;
            lVar5 = std::__cxx11::string::find(local_a0,0x1261c1,0);
            if (lVar5 != -1) {
              std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)__rhs);
              std::__cxx11::string::operator=((string *)local_a0,(string *)__return_storage_ptr__);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)c.field_2._8_8_ != &local_70) {
                operator_delete((void *)c.field_2._8_8_,local_70._M_allocated_capacity + 1);
              }
              std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)__rhs);
              std::__cxx11::string::operator=((string *)local_58,(string *)__return_storage_ptr__);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)c.field_2._8_8_ != &local_70) {
                operator_delete((void *)c.field_2._8_8_,local_70._M_allocated_capacity + 1);
              }
            }
            iVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                            *)a.field_2._8_8_,(key_type *)local_a0);
            if ((_Rb_tree_header *)iVar6._M_node ==
                &(this->data_)._M_t._M_impl.super__Rb_tree_header) {
              std::operator+(&local_c8,"invalid option \'",__rhs);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_c8);
              psVar12 = (size_type *)(plVar8 + 2);
              if ((size_type *)*plVar8 == psVar12) {
                local_70._M_allocated_capacity = *psVar12;
                local_70._8_8_ = plVar8[3];
                c.field_2._8_8_ = &local_70;
              }
              else {
                local_70._M_allocated_capacity = *psVar12;
                c.field_2._8_8_ = (size_type *)*plVar8;
              }
              *plVar8 = (long)psVar12;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::operator=(local_a8,(string *)__return_storage_ptr__);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)c.field_2._8_8_ != &local_70) {
                operator_delete((void *)c.field_2._8_8_,local_70._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              find_similar(this,(string *)local_a0);
LAB_00111776:
              uVar3 = false;
              iVar4 = iVar15;
            }
            else {
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                             *)a.field_2._8_8_,(key_type *)local_a0);
              if (pmVar7->seen_ == true) {
                std::operator+(&local_c8,"option \'--",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a0);
                plVar8 = (long *)std::__cxx11::string::append((char *)&local_c8);
LAB_00111078:
                psVar12 = (size_type *)(plVar8 + 2);
                if ((size_type *)*plVar8 == psVar12) {
                  local_70._M_allocated_capacity = *psVar12;
                  local_70._8_8_ = plVar8[3];
                  c.field_2._8_8_ = &local_70;
                }
                else {
                  local_70._M_allocated_capacity = *psVar12;
                  c.field_2._8_8_ = (size_type *)*plVar8;
                }
                *plVar8 = (long)psVar12;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::__cxx11::string::operator=(local_a8,(string *)__return_storage_ptr__);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)c.field_2._8_8_ != &local_70) {
                  operator_delete((void *)c.field_2._8_8_,local_70._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
                goto LAB_00111776;
              }
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                             *)a.field_2._8_8_,(key_type *)local_a0);
              if (pmVar7->mode_ == true) {
                if (a._M_dataplus._M_p == (pointer)0x0) {
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                                 *)a.field_2._8_8_,(key_type *)local_a0);
                  std::__cxx11::string::_M_replace
                            ((ulong)&pmVar7->value_,0,(char *)(pmVar7->value_)._M_string_length,
                             0x1260b9);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                                 *)a.field_2._8_8_,(key_type *)local_a0);
                }
                else {
LAB_001115e6:
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                                 *)a.field_2._8_8_,(key_type *)local_a0);
                  std::__cxx11::string::_M_assign((string *)&pmVar7->value_);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                                 *)a.field_2._8_8_,(key_type *)local_a0);
                }
                pmVar7->seen_ = true;
                uVar3 = true;
                iVar4 = iVar15;
              }
              else {
                if (a._M_dataplus._M_p != (pointer)0x0) goto LAB_001115e6;
                iVar4 = iVar15 + 1;
                if (_argc <= iVar4) {
                  std::operator+(&local_c8,"option \'--",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_a0);
                  plVar8 = (long *)std::__cxx11::string::append((char *)&local_c8);
                  goto LAB_00111078;
                }
                __rhs = (pointer)(long)iVar4;
                if ((pointer)((long)(_argv->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(_argv->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5) <= __rhs)
                goto LAB_00111a2d;
                pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                               *)a.field_2._8_8_,(key_type *)local_a0);
                std::__cxx11::string::_M_assign((string *)&pmVar7->value_);
                pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                               *)a.field_2._8_8_,(key_type *)local_a0);
                pmVar7->seen_ = true;
                uVar3 = true;
              }
            }
            if (local_58 != (undefined1  [8])&a._M_string_length) {
              operator_delete((void *)local_58,a._M_string_length + 1);
            }
            iVar15 = iVar4;
            if (local_a0 != (undefined1  [8])&c._M_string_length) {
              operator_delete((void *)local_a0,c._M_string_length + 1);
            }
          }
          else {
            local_a0 = (undefined1  [8])&c._M_string_length;
            c._M_dataplus._M_p = (pointer)0x1;
            c._M_string_length._0_2_ = CONCAT11(0,pcVar2[1]);
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::find(&local_60->_M_t,(key_type *)local_a0);
            iVar4 = iVar15;
            if ((_Rb_tree_header *)iVar9._M_node == p_Var1) {
LAB_00111161:
              uVar13 = __rhs->_M_string_length;
              uVar3 = true;
              if (1 < uVar13) {
                uVar16 = 1;
                do {
                  if (uVar13 <= uVar16) goto LAB_00111a0b;
                  local_58 = (undefined1  [8])&a._M_string_length;
                  a._M_dataplus._M_p = (pointer)0x1;
                  a._M_string_length._0_2_ = CONCAT11(0,(__rhs->_M_dataplus)._M_p[uVar16]);
                  iVar9 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::find(&local_60->_M_t,(key_type *)local_58);
                  if ((_Rb_tree_header *)iVar9._M_node == p_Var1) {
LAB_001112d1:
                    std::operator+(&local_c8,"invalid flag \'",__rhs);
                    plVar8 = (long *)std::__cxx11::string::append((char *)&local_c8);
LAB_00111422:
                    psVar12 = (size_type *)(plVar8 + 2);
                    if ((size_type *)*plVar8 == psVar12) {
                      local_70._M_allocated_capacity = *psVar12;
                      local_70._8_8_ = plVar8[3];
                      c.field_2._8_8_ = &local_70;
                    }
                    else {
                      local_70._M_allocated_capacity = *psVar12;
                      c.field_2._8_8_ = (size_type *)*plVar8;
                    }
                    *plVar8 = (long)psVar12;
                    plVar8[1] = 0;
                    *(undefined1 *)(plVar8 + 2) = 0;
                    std::__cxx11::string::operator=(local_a8,(string *)__return_storage_ptr__);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)c.field_2._8_8_ != &local_70) {
                      operator_delete((void *)c.field_2._8_8_,local_70._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                      operator_delete(local_c8._M_dataplus._M_p,
                                      local_c8.field_2._M_allocated_capacity + 1);
                    }
                    uVar11 = a._M_string_length;
                    uVar14 = local_58;
                    if (local_58 != (undefined1  [8])&a._M_string_length) goto LAB_001115cd;
                    goto LAB_001115d5;
                  }
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_60,(key_type *)local_58);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                                 *)a.field_2._8_8_,pmVar10);
                  if (pmVar7->mode_ != true) goto LAB_001112d1;
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_60,(key_type *)local_58);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                                 *)a.field_2._8_8_,pmVar10);
                  if (pmVar7->seen_ == true) {
                    std::operator+(&local_c8,"flag \'-",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_58);
                    plVar8 = (long *)std::__cxx11::string::append((char *)&local_c8);
                    goto LAB_00111422;
                  }
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_60,(key_type *)local_58);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                                 *)a.field_2._8_8_,pmVar10);
                  std::__cxx11::string::_M_replace
                            ((ulong)&pmVar7->value_,0,(char *)(pmVar7->value_)._M_string_length,
                             0x1260b9);
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_60,(key_type *)local_58);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                                 *)a.field_2._8_8_,pmVar10);
                  pmVar7->seen_ = true;
                  if (local_58 != (undefined1  [8])&a._M_string_length) {
                    operator_delete((void *)local_58,a._M_string_length + 1);
                  }
                  uVar16 = uVar16 + 1;
                  uVar13 = __rhs->_M_string_length;
                } while (uVar16 < uVar13);
LAB_00111839:
                uVar3 = true;
              }
            }
            else {
              pmVar10 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::at(local_60,(key_type *)local_a0);
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                             *)a.field_2._8_8_,pmVar10);
              if (pmVar7->mode_ != false) goto LAB_00111161;
              pmVar10 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::at(local_60,(key_type *)local_a0);
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                             *)a.field_2._8_8_,pmVar10);
              if (pmVar7->seen_ != true) {
                if (__rhs->_M_string_length < 3) {
LAB_0011131f:
                  iVar4 = iVar15 + 1;
                  if (_argc <= iVar4) {
                    std::operator+(__return_storage_ptr__,"flag \'-",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a0);
                    plVar8 = (long *)std::__cxx11::string::append((char *)__return_storage_ptr__);
                    goto LAB_00111556;
                  }
                  __rhs = (pointer)(long)iVar4;
                  if ((pointer)((long)(_argv->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(_argv->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= __rhs)
                  goto LAB_00111a1c;
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_60,(key_type *)local_a0);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                                 *)a.field_2._8_8_,pmVar10);
                  std::__cxx11::string::_M_assign((string *)&pmVar7->value_);
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_60,(key_type *)local_a0);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                                 *)a.field_2._8_8_,pmVar10);
                  pmVar7->seen_ = true;
                  uVar3 = true;
                  goto LAB_0011183c;
                }
                if ((__rhs->_M_dataplus)._M_p[2] == '=') {
                  if (__rhs->_M_string_length == 3) goto LAB_0011131f;
                  std::__cxx11::string::substr((ulong)local_58,(ulong)__rhs);
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_60,(key_type *)local_a0);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                                 *)a.field_2._8_8_,pmVar10);
                  std::__cxx11::string::operator=((string *)&pmVar7->value_,(string *)local_58);
                  if (local_58 != (undefined1  [8])&a._M_string_length) {
                    operator_delete((void *)local_58,a._M_string_length + 1);
                  }
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_60,(key_type *)local_a0);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                                 *)a.field_2._8_8_,pmVar10);
                }
                else {
                  std::__cxx11::string::substr((ulong)local_58,(ulong)__rhs);
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_60,(key_type *)local_a0);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                                 *)a.field_2._8_8_,pmVar10);
                  std::__cxx11::string::operator=((string *)&pmVar7->value_,(string *)local_58);
                  if (local_58 != (undefined1  [8])&a._M_string_length) {
                    operator_delete((void *)local_58,a._M_string_length + 1);
                  }
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_60,(key_type *)local_a0);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                                 *)a.field_2._8_8_,pmVar10);
                }
                pmVar7->seen_ = true;
                goto LAB_00111839;
              }
              std::operator+(__return_storage_ptr__,"flag \'-",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_a0);
              plVar8 = (long *)std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00111556:
              psVar12 = (size_type *)(plVar8 + 2);
              if ((size_type *)*plVar8 == psVar12) {
                a._M_string_length = *psVar12;
                a.field_2._M_allocated_capacity = plVar8[3];
                local_58 = (undefined1  [8])&a._M_string_length;
              }
              else {
                a._M_string_length = *psVar12;
                local_58 = (undefined1  [8])*plVar8;
              }
              a._M_dataplus._M_p = (pointer)plVar8[1];
              *plVar8 = (long)psVar12;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::operator=(local_a8,(string *)local_58);
              if (local_58 != (undefined1  [8])&a._M_string_length) {
                operator_delete((void *)local_58,a._M_string_length + 1);
              }
              uVar11 = local_70._M_allocated_capacity;
              uVar14 = c.field_2._8_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)c.field_2._8_8_ != &local_70) {
LAB_001115cd:
                operator_delete((void *)uVar14,uVar11 + 1);
              }
LAB_001115d5:
              uVar3 = false;
              iVar4 = iVar15;
            }
LAB_0011183c:
            iVar15 = iVar4;
            if (local_a0 != (undefined1  [8])&c._M_string_length) {
              operator_delete((void *)local_a0,c._M_string_length + 1);
            }
          }
          if (!(bool)uVar3) {
            return -1;
          }
          uVar16 = 0;
        }
      }
      else {
LAB_001110d3:
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->positional_vec_,__rhs);
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 < _argc);
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

int parse_args(int _argc, std::vector<std::string> const& _argv)
  {
    if (_argc < 1) return 1;

    bool dashdash {false};

    // loop through arg vector
    for (int i = 0; i < _argc; ++i)
    {
      std::string const& tmp {_argv.at(static_cast<std::size_t>(i))};
      // std::cerr << "ARG: " << i << " -> " << tmp << std::endl;

      if (dashdash)
      {
        positional_vec_.emplace_back(tmp);
        continue;
      }

      if (tmp.size() > 1 && tmp.at(0) == '-' && tmp.at(1) != '-')
      {
        // short
        // std::cerr << "SHORT: " << tmp << std::endl;

        std::string c {tmp.at(1)};
        if (flags_.find(c) != flags_.end() && !(data_.at(flags_.at(c)).mode_))
        {
          // short arg
          // std::cerr << "SHORT: arg -> " << c << std::endl;

          if (data_.at(flags_.at(c)).seen_)
          {
            // error
            error_ = "flag '-" + c + "' has already been seen";
            return -1;
          }

          if (tmp.size() > 2 && tmp.at(2) != '=')
          {
            data_.at(flags_.at(c)).value_ = tmp.substr(2, tmp.size() - 1);
            data_.at(flags_.at(c)).seen_ = true;
          }
          else if (tmp.size() > 3 && tmp.at(2) == '=')
          {
            data_.at(flags_.at(c)).value_ = tmp.substr(3, tmp.size() - 1);
            data_.at(flags_.at(c)).seen_ = true;
          }
          else if (i + 1 < _argc)
          {
            data_.at(flags_.at(c)).value_ = _argv.at(static_cast<std::size_t>(i + 1));
            data_.at(flags_.at(c)).seen_ = true;
            ++i;
          }
          else
          {
            // error
            error_ = "flag '-" + c + "' requires an arg";
            return -1;
          }
        }
        else
        {
          // short mode
          for (std::size_t j = 1; j < tmp.size(); ++j)
          {
            std::string s {tmp.at(j)};

            if (flags_.find(s) != flags_.end() && data_.at(flags_.at(s)).mode_)
            {
              // std::cerr << "SHORT: mode -> " << s << std::endl;

              if (data_.at(flags_.at(s)).seen_)
              {
                // error
                error_ = "flag '-" + s + "' has already been seen";
                return -1;
              }

              data_.at(flags_.at(s)).value_ = "1";
              data_.at(flags_.at(s)).seen_ = true;
            }
            else
            {
              // error
              error_ = "invalid flag '" + tmp + "'";
              // find_similar(s);

              return -1;
            }
          }
        }
      }
      else if (tmp.size() > 2 && tmp.at(0) == '-' && tmp.at(1) == '-')
      {
        // long || --
        // std::cerr << "LONG: " << tmp << std::endl;
        std::string c {tmp.substr(2, tmp.size() - 1)};
        std::string a;

        auto const delim = c.find("=");
        if (delim != std::string::npos)
        {
          c = tmp.substr(2, delim);
          a = tmp.substr(3 + delim, tmp.size() - 1);
        }

        if (data_.find(c) != data_.end())
        {
          if (data_.at(c).seen_)
          {
            // error
            error_ = "option '--" + c + "' has already been seen";
            return -1;
          }

          if (data_.at(c).mode_ && a.size() == 0)
          {
            // std::cerr << "LONG: mode -> " << c << std::endl;
            data_.at(c).value_ = "1";
            data_.at(c).seen_ = true;
          }
          else
          {
            // std::cerr << "LONG: arg -> " << c << std::endl;
            if (a.size() > 0)
            {
              data_.at(c).value_ = a;
              data_.at(c).seen_ = true;
            }
            else if (i + 1 < _argc)
            {
              data_.at(c).value_ = _argv.at(static_cast<std::size_t>(i + 1));
              data_.at(c).seen_ = true;
              ++i;
            }
            else
            {
              // error
              error_ = "option '--" + c + "' requires an arg";
              return -1;
            }
          }
        }
        else
        {
          // error
          error_ = "invalid option '" + tmp + "'";
          find_similar(c);
          return -1;
        }
      }
      else if (tmp.size() > 0 && is_positional_)
      {
        // positional
        // std::cerr << "POS: " << tmp << std::endl;
        if (tmp == "--")
        {
          dashdash = true;
        }
        else
        {
          positional_vec_.emplace_back(tmp);
        }
      }
      else
      {
        // error
        error_ = "no match for '" + tmp + "'";
        find_similar(tmp);
        return -1;
      }
    }

    return 0;
  }